

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

bool idx2::ToInt(stref *Str,int *Result)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  if (((Str->field_0).Ptr == (char *)0x0) || (Str->Size < 1)) {
LAB_00105a29:
    bVar2 = false;
  }
  else {
    cVar1 = *(Str->field_0).Ptr;
    *Result = 0;
    iVar8 = Str->Size;
    uVar6 = (uint)(cVar1 == '-');
    iVar3 = iVar8 - uVar6;
    bVar2 = iVar3 < 1;
    if (0 < iVar3) {
      iVar3 = -1;
      lVar7 = 0;
      do {
        if (iVar8 <= iVar8 + iVar3) {
          __assert_fail("Idx < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                        ,0x9b,"char &idx2::stref::operator[](int) const");
        }
        if (9 < (byte)((Str->field_0).Ptr[iVar8 + iVar3] - 0x30U)) goto LAB_00105a29;
        if (lVar7 == 9) {
          __assert_fail("Idx < N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x20c,
                        "t &idx2::stack_array<int, 9>::operator[](int) const [t = int, N = 9]");
        }
        iVar4 = ((byte)(Str->field_0).Ptr[iVar8 + iVar3] - 0x30) * power<int,_10>::Table.Arr[lVar7];
        iVar8 = -iVar4;
        if (cVar1 != '-') {
          iVar8 = iVar4;
        }
        *Result = *Result + iVar8;
        lVar7 = lVar7 + 1;
        iVar8 = Str->Size;
        lVar5 = (long)(int)(iVar8 - uVar6);
        iVar3 = iVar3 + -1;
        bVar2 = lVar5 <= lVar7;
      } while (lVar7 < lVar5);
    }
  }
  return bVar2;
}

Assistant:

bool
ToInt(const stref& Str, int* Result)
{
  stref& StrR = const_cast<stref&>(Str);
  if (!StrR || StrR.Size <= 0)
    return false;

  int Mult = 1, Start = 0;
  if (StrR[0] == '-')
  {
    Mult = -1;
    Start = 1;
  }
  *Result = 0;
  for (int I = 0; I < Str.Size - Start; ++I)
  {
    int V = StrR[StrR.Size - I - 1] - '0';
    if (V >= 0 && V < 10)
      *Result += Mult * (V * power<int, 10>()[I]);
    else
      return false;
  }
  return true;
}